

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

bool KingFacing(Situation *situation)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  bVar1 = situation->current_pieces[0x10];
  bVar2 = situation->current_pieces[0x20];
  if (bVar2 != 0 && bVar1 != 0) {
    uVar3 = bVar1 & 0xf;
    if (uVar3 == (bVar2 & 0xf)) {
      return (*(ushort *)
               ((ulong)((bVar1 & 0xf0) << 9) + 0x327d42 + (ulong)situation->bit_col[uVar3] * 8) &
             BIT_COL_MASK[(uint)bVar2]) != 0;
    }
  }
  return false;
}

Assistant:

bool KingFacing(const Situation & situation){
    // 1. 如果有一方没有将 则无效
    int red_king_pos = situation.current_pieces[GetPlayerFlag(RED) + 0], black_king_pos = situation.current_pieces[GetPlayerFlag(BLACK) + 0];
    if(red_king_pos == 0 || black_king_pos == 0){
        return false;
    }
    // 2. 先判断两个将是否在同一列
    if(GetCol(red_king_pos) != GetCol(black_king_pos)){
        return false;
    }
    // 3. 判断是否对将
    return (ROOK_CANNON_CAN_GET_COL_MASK[GetRow(red_king_pos) - 3][situation.bit_col[GetCol(red_king_pos)]].rook_capture & BIT_COL_MASK[black_king_pos]) != 0;
}